

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_bonsai_trie.hpp
# Opt level: O0

void __thiscall
poplar::
compact_bonsai_trie<90U,_3U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
::compact_bonsai_trie
          (compact_bonsai_trie<90U,_3U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
           *this,uint32_t capa_bits,uint32_t symb_bits,uint32_t cht_capa_bits)

{
  undefined1 auVar1 [16];
  uint *puVar2;
  size_p2 *this_00;
  uint64_t uVar3;
  uint32_t in_EDX;
  uint64_t *in_RDI;
  undefined1 auVar4 [16];
  compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *in_stack_fffffffffffffe88;
  compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *in_stack_fffffffffffffe90;
  compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *this_01;
  undefined8 in_stack_fffffffffffffe98;
  uint32_t univ_bits;
  split_mix_hasher *this_02;
  uint64_t in_stack_fffffffffffffed8;
  compact_vector *in_stack_fffffffffffffee0;
  uint32_t in_stack_ffffffffffffff38;
  uint32_t in_stack_ffffffffffffff3c;
  compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *in_stack_ffffffffffffff40;
  undefined1 local_90 [72];
  size_p2 local_48 [2];
  size_p2 local_28;
  uint32_t local_10;
  uint local_c [3];
  
  univ_bits = (uint32_t)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  local_10 = in_EDX;
  bijective_hash::split_mix_hasher::split_mix_hasher((split_mix_hasher *)0x1cf926);
  compact_vector::compact_vector((compact_vector *)in_stack_fffffffffffffe90);
  compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>::compact_hash_table
            (in_stack_fffffffffffffe90);
  standard_hash_table<80U,_poplar::hash::vigna_hasher>::standard_hash_table
            ((standard_hash_table<80U,_poplar::hash::vigna_hasher> *)in_stack_fffffffffffffe90);
  in_RDI[0x23] = 0;
  in_RDI[0x24] = 0;
  size_p2::size_p2((size_p2 *)(in_RDI + 0x25));
  size_p2::size_p2((size_p2 *)(in_RDI + 0x27));
  puVar2 = std::max<unsigned_int>(&min_capa_bits,local_c);
  size_p2::size_p2(&local_28,*puVar2);
  in_RDI[0x25] = local_28._0_8_;
  in_RDI[0x26] = local_28.mask_;
  size_p2::size_p2(local_48,local_10);
  this_00 = (size_p2 *)(in_RDI + 0x27);
  *(size_p2 *)(in_RDI + 0x27) = local_48[0];
  this_02 = (split_mix_hasher *)(in_RDI + 0x25);
  uVar3 = size_p2::size((size_p2 *)this_02);
  auVar1 = vcvtusi2sd_avx512f((undefined1  [16])local_48[0],uVar3 * 0x5a);
  auVar4._0_8_ = auVar1._0_8_ / 100.0;
  auVar4._8_8_ = auVar1._8_8_;
  uVar3 = vcvttsd2usi_avx512f(auVar4);
  in_RDI[0x24] = uVar3;
  size_p2::bits((size_p2 *)this_02);
  size_p2::bits(this_00);
  bijective_hash::split_mix_hasher::split_mix_hasher(this_02,univ_bits);
  in_RDI[2] = local_90._64_8_;
  *in_RDI = local_90._48_8_;
  in_RDI[1] = local_90._56_8_;
  size_p2::size((size_p2 *)(in_RDI + 0x25));
  size_p2::bits((size_p2 *)(in_RDI + 0x27));
  compact_vector::compact_vector
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,(uint32_t)((ulong)in_RDI >> 0x20));
  this_01 = (compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *)local_90;
  compact_vector::operator=((compact_vector *)this_01,(compact_vector *)in_stack_fffffffffffffe88);
  compact_vector::~compact_vector((compact_vector *)0x1cfaf6);
  size_p2::bits((size_p2 *)(in_RDI + 0x25));
  compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>::compact_hash_table
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
  compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>::operator=
            (this_01,in_stack_fffffffffffffe88);
  compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>::~compact_hash_table
            ((compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *)0x1cfb39);
  return;
}

Assistant:

compact_bonsai_trie(uint32_t capa_bits, uint32_t symb_bits, uint32_t cht_capa_bits = 0) {
        capa_size_ = size_p2{std::max(min_capa_bits, capa_bits)};
        symb_size_ = size_p2{symb_bits};

        max_size_ = static_cast<uint64_t>(capa_size_.size() * MaxFactor / 100.0);

        hasher_ = Hasher{capa_size_.bits() + symb_size_.bits()};
        table_ = compact_vector{capa_size_.size(), symb_size_.bits() + dsp1_bits};
        aux_cht_ = aux_cht_type{capa_size_.bits(), cht_capa_bits};
    }